

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator_1D_mri.c
# Opt level: O3

int fs(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double dVar1;
  double *pdVar2;
  double *pdVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  
  lVar6 = *user_data;
  dVar1 = *(double *)((long)user_data + 0x20);
  dVar7 = *(double *)((long)user_data + 8);
  pdVar2 = (double *)N_VGetArrayPointer();
  if (pdVar2 == (double *)0x0) {
    fs_cold_2();
  }
  else {
    pdVar3 = (double *)N_VGetArrayPointer(ydot);
    if (pdVar3 != (double *)0x0) {
      dVar7 = -dVar1 / dVar7;
      if (dVar1 <= -dVar1) {
        if (0.0 <= dVar1) {
          return 0;
        }
        lVar4 = lVar6 + -1;
        if (1 < lVar6) {
          lVar5 = 0;
          lVar6 = lVar4;
          do {
            *(double *)((long)pdVar3 + lVar5) =
                 (*(double *)((long)pdVar2 + lVar5 + 0x18) - *(double *)((long)pdVar2 + lVar5)) *
                 dVar7;
            *(double *)((long)pdVar3 + lVar5 + 8) =
                 (*(double *)((long)pdVar2 + lVar5 + 0x20) - *(double *)((long)pdVar2 + lVar5 + 8))
                 * dVar7;
            *(double *)((long)pdVar3 + lVar5 + 0x10) =
                 (*(double *)((long)pdVar2 + lVar5 + 0x28) -
                 *(double *)((long)pdVar2 + lVar5 + 0x10)) * dVar7;
            lVar5 = lVar5 + 0x18;
            lVar6 = lVar6 + -1;
          } while (lVar6 != 0);
        }
        pdVar3[lVar4 * 3] = (pdVar2[lVar4 * 3] - *pdVar2) * dVar7;
        pdVar3[lVar4 * 3 + 1] = (pdVar2[lVar4 * 3 + 1] - pdVar2[1]) * dVar7;
        pdVar3[lVar4 * 3 + 2] = (pdVar2[lVar4 * 3 + 2] - pdVar2[2]) * dVar7;
        return 0;
      }
      *pdVar3 = (*pdVar2 - pdVar2[lVar6 * 3 + -3]) * dVar7;
      pdVar3[1] = (pdVar2[1] - pdVar2[lVar6 * 3 + -2]) * dVar7;
      pdVar3[2] = (pdVar2[2] - pdVar2[lVar6 * 3 + -1]) * dVar7;
      if (lVar6 < 2) {
        return 0;
      }
      lVar6 = lVar6 + -1;
      lVar4 = 0x18;
      do {
        *(double *)((long)pdVar3 + lVar4) =
             (*(double *)((long)pdVar2 + lVar4) - *(double *)((long)pdVar2 + lVar4 + -0x18)) * dVar7
        ;
        *(double *)((long)pdVar3 + lVar4 + 8) =
             (*(double *)((long)pdVar2 + lVar4 + 8) - *(double *)((long)pdVar2 + lVar4 + -0x10)) *
             dVar7;
        *(double *)((long)pdVar3 + lVar4 + 0x10) =
             (*(double *)((long)pdVar2 + lVar4 + 0x10) - *(double *)((long)pdVar2 + lVar4 + -8)) *
             dVar7;
        lVar4 = lVar4 + 0x18;
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
      return 0;
    }
    fs_cold_1();
  }
  return 1;
}

Assistant:

static int fs(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  UserData udata      = (UserData)user_data; /* access problem data    */
  sunindextype N      = udata->N;            /* set variable shortcuts */
  sunrealtype c       = udata->c;
  sunrealtype dx      = udata->dx;
  sunrealtype* Ydata  = NULL;
  sunrealtype* dYdata = NULL;
  sunrealtype tmp;
  sunindextype i;

  /* access data arrays */
  Ydata = N_VGetArrayPointer(y);
  if (check_retval((void*)Ydata, "N_VGetArrayPointer", 0)) { return 1; }

  dYdata = N_VGetArrayPointer(ydot);
  if (check_retval((void*)dYdata, "N_VGetArrayPointer", 0)) { return 1; }

  /* iterate over domain, computing advection */
  tmp = -c / dx;

  if (c > ZERO)
  {
    /*
     * right moving flow
     */

    /* left boundary Jacobian entries */
    dYdata[IDX(0, 0)] = tmp * (Ydata[IDX(0, 0)] - Ydata[IDX(N - 1, 0)]);
    dYdata[IDX(0, 1)] = tmp * (Ydata[IDX(0, 1)] - Ydata[IDX(N - 1, 1)]);
    dYdata[IDX(0, 2)] = tmp * (Ydata[IDX(0, 2)] - Ydata[IDX(N - 1, 2)]);

    /* interior Jacobian entries */
    for (i = 1; i < N; i++)
    {
      dYdata[IDX(i, 0)] = tmp * (Ydata[IDX(i, 0)] - Ydata[IDX(i - 1, 0)]);
      dYdata[IDX(i, 1)] = tmp * (Ydata[IDX(i, 1)] - Ydata[IDX(i - 1, 1)]);
      dYdata[IDX(i, 2)] = tmp * (Ydata[IDX(i, 2)] - Ydata[IDX(i - 1, 2)]);
    }
  }
  else if (c < ZERO)
  {
    /*
     * left moving flow
     */

    /* interior Jacobian entries */
    for (i = 0; i < N - 1; i++)
    {
      dYdata[IDX(i, 0)] = tmp * (Ydata[IDX(i + 1, 0)] - Ydata[IDX(i, 0)]);
      dYdata[IDX(i, 1)] = tmp * (Ydata[IDX(i + 1, 1)] - Ydata[IDX(i, 1)]);
      dYdata[IDX(i, 2)] = tmp * (Ydata[IDX(i + 1, 2)] - Ydata[IDX(i, 2)]);
    }

    /* right boundary Jacobian entries */
    dYdata[IDX(N - 1, 0)] = tmp * (Ydata[IDX(N - 1, 0)] - Ydata[IDX(0, 0)]);
    dYdata[IDX(N - 1, 1)] = tmp * (Ydata[IDX(N - 1, 1)] - Ydata[IDX(0, 1)]);
    dYdata[IDX(N - 1, 2)] = tmp * (Ydata[IDX(N - 1, 2)] - Ydata[IDX(0, 2)]);
  }

  /* return success */
  return (0);
}